

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeaderStructs.cpp
# Opt level: O2

void copyBytes(ostream *dst,istream *src,int len)

{
  int i;
  int iVar1;
  char buf [512];
  undefined1 local_238 [520];
  
  for (iVar1 = 0; iVar1 < len; iVar1 = iVar1 + 0x200) {
    std::istream::read((char *)src,(long)local_238);
    std::ostream::write((char *)dst,(long)local_238);
  }
  return;
}

Assistant:

void copyBytes(std::ostream& dst, std::istream& src, int len) {
	constexpr int BUFLEN = 512;
	char buf[BUFLEN];
	for (int i = 0; i < len; i += BUFLEN) {
		int amt = std::min(len - i, BUFLEN);
		src.read(buf, amt);
		dst.write(buf, amt);
	}
}